

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode Curl_mime_prepare_headers
                   (Curl_easy *data,curl_mimepart *part,char *contenttype,char *disposition,
                   mimestrategy strategy)

{
  curl_slist **slp;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  CURLcode CVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  curl_slist *pcVar10;
  char *pcVar11;
  char *pcVar12;
  curl_mimepart *part_00;
  char **local_60;
  
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = (curl_slist *)0x0;
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).ptr = (void *)0x0;
    (part->state).offset = 0;
  }
  pcVar6 = part->mimetype;
  if (pcVar6 == (char *)0x0) {
    pcVar10 = part->userheaders;
    if (pcVar10 == (curl_slist *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      do {
        pcVar6 = match_header(pcVar10,"Content-Type",0xc);
        if (pcVar6 != (char *)0x0) break;
        pcVar10 = pcVar10->next;
      } while (pcVar10 != (curl_slist *)0x0);
    }
  }
  if (pcVar6 != (char *)0x0) {
    contenttype = pcVar6;
  }
  if (contenttype == (char *)0x0) {
    if (part->kind == MIMEKIND_MULTIPART) {
      contenttype = "multipart/mixed";
    }
    else if (part->kind == MIMEKIND_FILE) {
      contenttype = Curl_mime_contenttype(part->filename);
      if (((contenttype == (char *)0x0) &&
          (contenttype = Curl_mime_contenttype(part->data), contenttype == (char *)0x0)) &&
         (contenttype = "application/octet-stream", part->filename == (char *)0x0)) {
        contenttype = (char *)0x0;
      }
    }
    else {
      contenttype = Curl_mime_contenttype(part->filename);
    }
  }
  if (part->kind == MIMEKIND_MULTIPART) {
    part_00 = (curl_mimepart *)part->arg;
    local_60 = &part_00->data;
    if (part_00 == (curl_mimepart *)0x0) {
      local_60 = (char **)0x0;
    }
  }
  else {
    if ((((pcVar6 == (char *)0x0) && (contenttype != (char *)0x0)) &&
        ((iVar4 = curl_strnequal(contenttype,"text/plain",10), iVar4 != 0 &&
         (((ulong)(byte)contenttype[10] < 0x3c &&
          ((0x800000100002601U >> ((ulong)(byte)contenttype[10] & 0x3f) & 1) != 0)))))) &&
       ((strategy == MIMESTRATEGY_MAIL || (part->filename == (char *)0x0)))) {
      contenttype = (char *)0x0;
    }
    part_00 = (curl_mimepart *)0x0;
    local_60 = (char **)0x0;
  }
  slp = &part->curlheaders;
  pcVar10 = part->userheaders;
  if (pcVar10 == (curl_slist *)0x0) {
LAB_006705ae:
    if (((disposition != (char *)0x0) || (disposition = "attachment", part->filename != (char *)0x0)
        ) || (part->name != (char *)0x0)) {
LAB_006705d1:
      iVar4 = curl_strequal(disposition,"attachment");
      pcVar6 = part->name;
      if (iVar4 == 0) {
        if (pcVar6 != (char *)0x0) goto LAB_00670602;
LAB_00670625:
        pcVar6 = (char *)0x0;
LAB_00670627:
        if (part->filename == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = escape_string(data,part->filename,strategy);
          if (pcVar7 == (char *)0x0) {
            CVar5 = CURLE_OUT_OF_MEMORY;
            pcVar7 = (char *)0x0;
            goto LAB_006706bb;
          }
        }
        pcVar8 = "; name=\"";
        pcVar11 = pcVar6;
        if (pcVar6 == (char *)0x0) {
          pcVar8 = "";
          pcVar11 = "";
        }
        pcVar2 = "\n\t\t\t\"";
        pcVar3 = "\n\t\t\t\"";
        if (pcVar6 == (char *)0x0) {
          pcVar3 = "PK\x01\x02";
        }
        pcVar12 = "; filename=\"";
        pcVar9 = pcVar7;
        if (pcVar7 == (char *)0x0) {
          pcVar12 = "";
          pcVar9 = "";
          pcVar2 = "PK\x01\x02";
        }
        CVar5 = Curl_mime_add_header
                          (slp,"Content-Disposition: %s%s%s%s%s%s%s",disposition,pcVar8,pcVar11,
                           pcVar3 + 4,pcVar12,pcVar9,pcVar2 + 4);
      }
      else {
        if (pcVar6 == (char *)0x0) {
          if (part->filename == (char *)0x0) goto LAB_006706df;
          goto LAB_00670625;
        }
LAB_00670602:
        pcVar6 = escape_string(data,pcVar6,strategy);
        if (pcVar6 != (char *)0x0) goto LAB_00670627;
        CVar5 = CURLE_OUT_OF_MEMORY;
        pcVar7 = (char *)0x0;
        pcVar6 = (char *)0x0;
      }
LAB_006706bb:
      (*Curl_cfree)(pcVar6);
      (*Curl_cfree)(pcVar7);
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      goto LAB_006706df;
    }
    if (contenttype == (char *)0x0) goto LAB_0067074d;
    iVar4 = curl_strnequal(contenttype,"multipart/",10);
    if (iVar4 == 0) goto LAB_006705d1;
LAB_006706e4:
    pcVar6 = "; boundary=";
    if (local_60 == (char **)0x0) {
      pcVar6 = "";
      local_60 = (char **)0x909629;
    }
    CVar5 = Curl_mime_add_header(slp,"Content-Type: %s%s%s",contenttype,pcVar6,local_60);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    bVar1 = true;
  }
  else {
    do {
      pcVar6 = match_header(pcVar10,"Content-Disposition",0x13);
      if (pcVar6 != (char *)0x0) break;
      pcVar10 = pcVar10->next;
    } while (pcVar10 != (curl_slist *)0x0);
    if (pcVar6 == (char *)0x0) goto LAB_006705ae;
LAB_006706df:
    if (contenttype != (char *)0x0) goto LAB_006706e4;
LAB_0067074d:
    bVar1 = false;
  }
  pcVar10 = part->userheaders;
  if (pcVar10 != (curl_slist *)0x0) {
    do {
      pcVar6 = match_header(pcVar10,"Content-Transfer-Encoding",0x19);
      if (pcVar6 != (char *)0x0) break;
      pcVar10 = pcVar10->next;
    } while (pcVar10 != (curl_slist *)0x0);
    if (pcVar6 != (char *)0x0) goto LAB_006707d8;
  }
  if (part->encoder == (mime_encoder *)0x0) {
    if ((!bVar1 || strategy != MIMESTRATEGY_MAIL) || (part->kind == MIMEKIND_MULTIPART))
    goto LAB_006707d8;
    pcVar6 = "8bit";
  }
  else {
    pcVar6 = part->encoder->name;
    if (pcVar6 == (char *)0x0) goto LAB_006707d8;
  }
  CVar5 = Curl_mime_add_header(slp,"Content-Transfer-Encoding: %s",pcVar6);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
LAB_006707d8:
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).ptr = part->curlheaders;
    (part->state).offset = 0;
  }
  CVar5 = CURLE_OK;
  if ((part_00 != (curl_mimepart *)0x0) && (part->kind == MIMEKIND_MULTIPART)) {
    if (contenttype == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      iVar4 = curl_strnequal(contenttype,"multipart/form-data",0x13);
      if (iVar4 == 0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = (char *)0x0;
        if (((ulong)(byte)contenttype[0x13] < 0x3c) &&
           ((0x800000100002601U >> ((ulong)(byte)contenttype[0x13] & 0x3f) & 1) != 0)) {
          pcVar6 = "form-data";
        }
      }
    }
    do {
      part_00 = part_00->nextpart;
      if (part_00 == (curl_mimepart *)0x0) {
        return CURLE_OK;
      }
      CVar5 = Curl_mime_prepare_headers(data,part_00,(char *)0x0,pcVar6,strategy);
    } while (CVar5 == CURLE_OK);
  }
  return CVar5;
}

Assistant:

CURLcode Curl_mime_prepare_headers(struct Curl_easy *data,
                                   curl_mimepart *part,
                                   const char *contenttype,
                                   const char *disposition,
                                   enum mimestrategy strategy)
{
  curl_mime *mime = NULL;
  const char *boundary = NULL;
  char *customct;
  const char *cte = NULL;
  CURLcode ret = CURLE_OK;

  /* Get rid of previously prepared headers. */
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = NULL;

  /* Be sure we won't access old headers later. */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, NULL);

  /* Check if content type is specified. */
  customct = part->mimetype;
  if(!customct)
    customct = search_header(part->userheaders, STRCONST("Content-Type"));
  if(customct)
    contenttype = customct;

  /* If content type is not specified, try to determine it. */
  if(!contenttype) {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      contenttype = MULTIPART_CONTENTTYPE_DEFAULT;
      break;
    case MIMEKIND_FILE:
      contenttype = Curl_mime_contenttype(part->filename);
      if(!contenttype)
        contenttype = Curl_mime_contenttype(part->data);
      if(!contenttype && part->filename)
        contenttype = FILE_CONTENTTYPE_DEFAULT;
      break;
    default:
      contenttype = Curl_mime_contenttype(part->filename);
      break;
    }
  }

  if(part->kind == MIMEKIND_MULTIPART) {
    mime = (curl_mime *) part->arg;
    if(mime)
      boundary = mime->boundary;
  }
  else if(contenttype && !customct &&
          content_type_match(contenttype, STRCONST("text/plain")))
    if(strategy == MIMESTRATEGY_MAIL || !part->filename)
      contenttype = NULL;

  /* Issue content-disposition header only if not already set by caller. */
  if(!search_header(part->userheaders, STRCONST("Content-Disposition"))) {
    if(!disposition)
      if(part->filename || part->name ||
        (contenttype && !strncasecompare(contenttype, "multipart/", 10)))
          disposition = DISPOSITION_DEFAULT;
    if(disposition && curl_strequal(disposition, "attachment") &&
     !part->name && !part->filename)
      disposition = NULL;
    if(disposition) {
      char *name = NULL;
      char *filename = NULL;

      if(part->name) {
        name = escape_string(data, part->name, strategy);
        if(!name)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret && part->filename) {
        filename = escape_string(data, part->filename, strategy);
        if(!filename)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret)
        ret = Curl_mime_add_header(&part->curlheaders,
                                   "Content-Disposition: %s%s%s%s%s%s%s",
                                   disposition,
                                   name? "; name=\"": "",
                                   name? name: "",
                                   name? "\"": "",
                                   filename? "; filename=\"": "",
                                   filename? filename: "",
                                   filename? "\"": "");
      Curl_safefree(name);
      Curl_safefree(filename);
      if(ret)
        return ret;
      }
    }

  /* Issue Content-Type header. */
  if(contenttype) {
    ret = add_content_type(&part->curlheaders, contenttype, boundary);
    if(ret)
      return ret;
  }

  /* Content-Transfer-Encoding header. */
  if(!search_header(part->userheaders,
                    STRCONST("Content-Transfer-Encoding"))) {
    if(part->encoder)
      cte = part->encoder->name;
    else if(contenttype && strategy == MIMESTRATEGY_MAIL &&
     part->kind != MIMEKIND_MULTIPART)
      cte = "8bit";
    if(cte) {
      ret = Curl_mime_add_header(&part->curlheaders,
                                 "Content-Transfer-Encoding: %s", cte);
      if(ret)
        return ret;
    }
  }

  /* If we were reading curl-generated headers, restart with new ones (this
     should not occur). */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, part->curlheaders);

  /* Process subparts. */
  if(part->kind == MIMEKIND_MULTIPART && mime) {
    curl_mimepart *subpart;

    disposition = NULL;
    if(content_type_match(contenttype, STRCONST("multipart/form-data")))
      disposition = "form-data";
    for(subpart = mime->firstpart; subpart; subpart = subpart->nextpart) {
      ret = Curl_mime_prepare_headers(data, subpart, NULL,
                                      disposition, strategy);
      if(ret)
        return ret;
    }
  }
  return ret;
}